

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strcmp_s.c
# Opt level: O1

errno_t strcmp_s(char *dest,rsize_t dmax,char *src,int *indicator)

{
  long lVar1;
  char cVar2;
  errno_t error;
  errno_t eVar3;
  char *msg;
  rsize_t rVar4;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (indicator == (int *)0x0) {
    msg = "strcmp_s: indicator is null";
LAB_00104c0c:
    eVar3 = 400;
    error = 400;
  }
  else {
    *indicator = 0;
    if (dest == (char *)0x0) {
      msg = "strcmp_s: dest is null";
      goto LAB_00104c0c;
    }
    if (src == (char *)0x0) {
      msg = "strcmp_s: src is null";
      goto LAB_00104c0c;
    }
    if (dmax == 0) {
      msg = "strcmp_s: dmax is 0";
      eVar3 = 0x191;
      error = 0x191;
    }
    else {
      if (dmax < 0x10000001) {
        cVar2 = *dest;
        if (cVar2 != '\0') {
          rVar4 = 0;
          do {
            if (((cVar2 != src[rVar4]) || (src[rVar4] == '\0')) || (dmax == rVar4)) break;
            cVar2 = dest[rVar4 + 1];
            rVar4 = rVar4 + 1;
          } while (cVar2 != '\0');
          src = src + rVar4;
        }
        *indicator = (int)cVar2 - (int)*src;
        eVar3 = 0;
        goto LAB_00104c1d;
      }
      msg = "strcmp_s: dmax exceeds max";
      eVar3 = 0x193;
      error = 0x193;
    }
  }
  invoke_safe_str_constraint_handler(msg,(void *)0x0,error);
LAB_00104c1d:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return eVar3;
  }
  __stack_chk_fail();
}

Assistant:

errno_t
strcmp_s (const char *dest, rsize_t dmax,
          const char *src, int *indicator)
{
    if (indicator == NULL) {
        invoke_safe_str_constraint_handler("strcmp_s: indicator is null",
                   NULL, ESNULLP);
        return RCNEGATE(ESNULLP);
    }
    *indicator = 0;

    if (dest == NULL) {
        invoke_safe_str_constraint_handler("strcmp_s: dest is null",
                   NULL, ESNULLP);
        return RCNEGATE(ESNULLP);
    }

    if (src == NULL) {
        invoke_safe_str_constraint_handler("strcmp_s: src is null",
                   NULL, ESNULLP);
        return RCNEGATE(ESNULLP);
    }

    if (dmax == 0) {
        invoke_safe_str_constraint_handler("strcmp_s: dmax is 0",
                   NULL, ESZEROL);
        return RCNEGATE(ESZEROL);
    }

    if (dmax > RSIZE_MAX_STR) {
        invoke_safe_str_constraint_handler("strcmp_s: dmax exceeds max",
                   NULL, ESLEMAX);
        return RCNEGATE(ESLEMAX);
    }

    while (*dest && *src && dmax) {

        if (*dest != *src) {
            break;
        }

        dest++;
        src++;
        dmax--;
    }

    *indicator = *dest - *src;
    return RCNEGATE(EOK);
}